

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_89(QPDF *pdf,char *arg2)

{
  allocator<char> local_d1;
  string local_d0 [32];
  QPDFObjectHandle local_b0;
  QPDFObjectHandle local_a0;
  allocator<char> local_89;
  string local_88 [32];
  QPDFObjectHandle local_68;
  QPDFObjectHandle local_58 [2];
  QPDFObjectHandle local_38;
  undefined1 local_28 [8];
  QPDFObjectHandle null;
  char *arg2_local;
  QPDF *pdf_local;
  
  null.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  QPDFObjectHandle::newNull();
  QPDF::getTrailer();
  QPDFObjectHandle::appendItem((QPDFObjectHandle *)&local_38);
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  QPDF::getRoot();
  QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_58);
  QPDFObjectHandle::~QPDFObjectHandle(local_58);
  QPDF::getObjectByID((int)&local_68,(int)pdf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"/X",&local_89);
  QPDFObjectHandle::replaceKey((string *)&local_68,(QPDFObjectHandle *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  QPDFObjectHandle::~QPDFObjectHandle(&local_68);
  QPDF::getObjectByID((int)&local_b0,(int)pdf);
  QPDFObjectHandle::getArrayItem((int)&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"/X",&local_d1);
  QPDFObjectHandle::replaceKey((string *)&local_a0,(QPDFObjectHandle *)local_d0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  QPDFObjectHandle::~QPDFObjectHandle(&local_a0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_b0);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  return;
}

Assistant:

static void
test_89(QPDF& pdf, char const* arg2)
{
    // Generate object warning with json-input. Crafted to work with
    // manual-qpdf-json.json.
    auto null = QPDFObjectHandle::newNull();
    pdf.getTrailer().appendItem(null);
    pdf.getRoot().appendItem(null);
    pdf.getObjectByID(5, 0).replaceKey("/X", null);
    pdf.getObjectByID(5, 0).getArrayItem(0).replaceKey("/X", null);
}